

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

void Fixpp::
     set<Fixpp::TagT<385u,Fixpp::Type::Char>,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>,char>
               (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                *message,char *value)

{
  type_by_index_t<1UL,_Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  *this;
  bool *pbVar1;
  char *value_local;
  InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  *message_local;
  
  this = meta::
         get<1ul,Fixpp::Field<Fixpp::TagT<372u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<385u,Fixpp::Type::Char>>>
                   ((tuple<Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                     *)message);
  Field<Fixpp::TagT<385U,_Fixpp::Type::Char>_>::set<char>(this,value);
  std::bitset<2UL>::set
            (&(message->
              super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
              ).allBits,1,true);
  pbVar1 = identity<bool>(&details::
                           TagIndex<meta::typelist::NullType,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                           ::Valid);
  if ((*pbVar1 & 1U) != 0) {
    std::bitset<0UL>::set
              ((bitset<0UL> *)
               &(message->
                super_MessageBase<Fixpp::Field,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                ).field_0x30,0xffffffffffffffff,true);
  }
  return;
}

Assistant:

decltype(auto)
    set(Message& message, Value&& value)
    {
        using Index = details::TagIndex<typename Message::TagsList, Tag>;
        using RequiredIndex = details::TagIndex<typename Message::RequiredList, Tag>;

        static_assert(Index::Valid, "Invalid tag for given message");
        static_assert(details::IsValidTypeFor<Tag, Value>::value, "Invalid data type for given Tag");

        meta::get<Index::Value>(message.values).set(std::forward<Value>(value));

        message.allBits.set(Index::Value);

        if (identity(RequiredIndex::Valid))
            message.requiredBits.set(static_cast<size_t>(RequiredIndex::Value));
    }